

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O0

void __thiscall
flatbuffers::lobster::LobsterGenerator::GenStructAccessor
          (LobsterGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar4;
  reference ppEVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c50;
  string local_c30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b50;
  EnumVal *local_b30;
  EnumVal *ev;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_b20;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a98;
  string local_a78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a38;
  string local_a18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_998;
  string local_978;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_918;
  string local_8f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858;
  string local_838;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  undefined1 local_7d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> start;
  Type vectortype;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f8;
  allocator<char> local_6d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  undefined1 local_510 [8];
  string name;
  string local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  string local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  string local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  byte local_182;
  allocator<char> local_181;
  undefined1 local_180 [8];
  string defval;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  string acc;
  string local_90;
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> def;
  string offsets;
  string *code;
  string *code_ptr_local;
  FieldDef *field_local;
  StructDef *struct_def_local;
  LobsterGenerator *this_local;
  
  GenComment(&(field->super_Definition).doc_comment,code_ptr,(CommentConfig *)0x0,"    ");
  NumToString<unsigned_short>((string *)((long)&def.field_2 + 8),(field->value).offset);
  NormalizedName_abi_cxx11_(&local_90,this,&field->super_Definition);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 "    def ",&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  bVar1 = IsScalar((field->value).type.base_type);
  if (bVar1) {
    std::__cxx11::string::string((string *)local_c0);
    if ((struct_def->fixed & 1U) == 0) {
      local_182 = 0;
      bVar1 = FieldDef::IsOptional(field);
      if (bVar1) {
        bVar1 = IsFloat((field->value).type.base_type);
        pcVar2 = "0";
        if (bVar1) {
          pcVar2 = "0.0";
        }
        std::allocator<char>::allocator();
        local_182 = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)local_180,pcVar2,&local_181);
      }
      else {
        std::__cxx11::string::string((string *)local_180,(string *)&(field->value).constant);
      }
      if ((local_182 & 1) != 0) {
        std::allocator<char>::~allocator(&local_181);
      }
      GenTypeName_abi_cxx11_(&local_268,this,&(field->value).type);
      std::operator+(&local_248,"flatbuffers.field_",&local_268);
      std::operator+(&local_228,&local_248,"(buf_, pos_, ");
      std::operator+(&local_208,&local_228,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&def.field_2 + 8));
      std::operator+(&local_1e8,&local_208,", ");
      std::operator+(&local_1c8,&local_1e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180)
      ;
      std::operator+(&local_1a8,&local_1c8,")");
      std::__cxx11::string::operator=((string *)local_c0,(string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::string::~string((string *)&local_268);
      bVar1 = IsBool((field->value).type.base_type);
      if (bVar1) {
        std::operator+(&local_2a8,"bool(",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0
                      );
        std::operator+(&local_288,&local_2a8,")");
        std::__cxx11::string::operator=((string *)local_c0,(string *)&local_288);
        std::__cxx11::string::~string((string *)&local_288);
        std::__cxx11::string::~string((string *)&local_2a8);
      }
      std::__cxx11::string::~string((string *)local_180);
    }
    else {
      GenTypeName_abi_cxx11_((string *)((long)&defval.field_2 + 8),this,&(field->value).type);
      std::operator+(&local_140,"buf_.read_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&defval.field_2 + 8));
      std::operator+(&local_120,&local_140,"_le(pos_ + ");
      std::operator+(&local_100,&local_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&def.field_2 + 8));
      std::operator+(&local_e0,&local_100,")");
      std::__cxx11::string::operator=((string *)local_c0,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)(defval.field_2._M_local_buf + 8));
    }
    if ((field->value).type.enum_def != (EnumDef *)0x0) {
      NormalizedName_abi_cxx11_(&local_328,this,&((field->value).type.enum_def)->super_Definition);
      std::operator+(&local_308,&local_328,"(");
      std::operator+(&local_2e8,&local_308,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
      std::operator+(&local_2c8,&local_2e8,")");
      std::__cxx11::string::operator=((string *)local_c0,(string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::~string((string *)&local_328);
    }
    bVar1 = FieldDef::IsOptional(field);
    if (bVar1) {
      std::operator+(&local_368,", flatbuffers.field_present(buf_, pos_, ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&def.field_2 + 8));
      std::operator+(&local_348,&local_368,")");
      std::__cxx11::string::operator+=((string *)local_c0,(string *)&local_348);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_368);
      std::operator+(&local_408,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     "() -> ");
      LobsterType_abi_cxx11_(&local_428,this,&(field->value).type);
      std::operator+(&local_3e8,&local_408,&local_428);
      std::operator+(&local_3c8,&local_3e8,", bool:\n        return ");
      std::operator+(&local_3a8,&local_3c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
      std::operator+(&local_388,&local_3a8,"\n");
      std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_388);
      std::__cxx11::string::~string((string *)&local_388);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_428);
      std::__cxx11::string::~string((string *)&local_408);
    }
    else {
      std::operator+(&local_4c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     "() -> ");
      LobsterType_abi_cxx11_(&local_4e8,this,&(field->value).type);
      std::operator+(&local_4a8,&local_4c8,&local_4e8);
      std::operator+(&local_488,&local_4a8,":\n        return ");
      std::operator+(&local_468,&local_488,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
      std::operator+(&local_448,&local_468,"\n");
      std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_448);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&local_468);
      std::__cxx11::string::~string((string *)&local_488);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::__cxx11::string::~string((string *)&local_4c8);
    }
    name.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_c0);
  }
  else {
    switch((field->value).type.base_type) {
    case BASE_TYPE_STRING:
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vectortype.fixed_length,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     "() -> string:\n        return flatbuffers.field_string(buf_, pos_, ");
      std::operator+(&local_778,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vectortype.fixed_length,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&def.field_2 + 8));
      std::operator+(&local_758,&local_778,")\n");
      std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_758);
      std::__cxx11::string::~string((string *)&local_758);
      std::__cxx11::string::~string((string *)&local_778);
      std::__cxx11::string::~string((string *)&vectortype.fixed_length);
      break;
    case BASE_TYPE_VECTOR:
      Type::VectorType((Type *)((long)&start.field_2 + 8),&(field->value).type);
      if (start.field_2._8_4_ == 0xf) {
        std::operator+(&local_818,"flatbuffers.field_vector(buf_, pos_, ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&def.field_2 + 8));
        std::operator+(&local_7f8,&local_818,") + i * ");
        sVar3 = InlineSize((Type *)((long)&start.field_2 + 8));
        NumToString<unsigned_long>(&local_838,sVar3);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_7d8,&local_7f8,&local_838);
        std::__cxx11::string::~string((string *)&local_838);
        std::__cxx11::string::~string((string *)&local_7f8);
        std::__cxx11::string::~string((string *)&local_818);
        if ((*(byte *)(vectortype._0_8_ + 0x110) & 1) == 0) {
          std::operator+(&local_878,"flatbuffers.indirect(buf_, ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_7d8);
          std::operator+(&local_858,&local_878,")");
          std::__cxx11::string::operator=((string *)local_7d8,(string *)&local_858);
          std::__cxx11::string::~string((string *)&local_858);
          std::__cxx11::string::~string((string *)&local_878);
        }
        std::operator+(&local_8d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                       ,"(i:int) -> ");
        NamespacedName_abi_cxx11_
                  (&local_8f8,this,&((field->value).type.struct_def)->super_Definition);
        std::operator+(&local_8b8,&local_8d8,&local_8f8);
        std::operator+(&local_898,&local_8b8,":\n        return ");
        std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_898);
        std::__cxx11::string::~string((string *)&local_898);
        std::__cxx11::string::~string((string *)&local_8b8);
        std::__cxx11::string::~string((string *)&local_8f8);
        std::__cxx11::string::~string((string *)&local_8d8);
        NamespacedName_abi_cxx11_
                  (&local_978,this,&((field->value).type.struct_def)->super_Definition);
        std::operator+(&local_958,&local_978," { buf_, ");
        std::operator+(&local_938,&local_958,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_7d8);
        std::operator+(&local_918,&local_938," }\n");
        std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_918);
        std::__cxx11::string::~string((string *)&local_918);
        std::__cxx11::string::~string((string *)&local_938);
        std::__cxx11::string::~string((string *)&local_958);
        std::__cxx11::string::~string((string *)&local_978);
        std::__cxx11::string::~string((string *)local_7d8);
      }
      else {
        bVar1 = IsString((Type *)((long)&start.field_2 + 8));
        if (bVar1) {
          std::operator+(&local_998,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_70,"(i:int) -> string:\n        return ");
          std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_998);
          std::__cxx11::string::~string((string *)&local_998);
          std::__cxx11::string::operator+=((string *)code_ptr,"flatbuffers.string");
        }
        else {
          std::operator+(&local_9f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_70,"(i:int) -> ");
          LobsterType_abi_cxx11_(&local_a18,this,(Type *)((long)&start.field_2 + 8));
          std::operator+(&local_9d8,&local_9f8,&local_a18);
          std::operator+(&local_9b8,&local_9d8,":\n        return ");
          std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_9b8);
          std::__cxx11::string::~string((string *)&local_9b8);
          std::__cxx11::string::~string((string *)&local_9d8);
          std::__cxx11::string::~string((string *)&local_a18);
          std::__cxx11::string::~string((string *)&local_9f8);
          GenTypeName_abi_cxx11_(&local_a78,this,(Type *)((long)&start.field_2 + 8));
          std::operator+(&local_a58,"read_",&local_a78);
          std::operator+(&local_a38,&local_a58,"_le");
          std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_a38);
          std::__cxx11::string::~string((string *)&local_a38);
          std::__cxx11::string::~string((string *)&local_a58);
          std::__cxx11::string::~string((string *)&local_a78);
        }
        std::operator+(&local_af8,"(buf_, buf_.flatbuffers.field_vector(pos_, ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&def.field_2 + 8));
        std::operator+(&local_ad8,&local_af8,") + i * ");
        sVar3 = InlineSize((Type *)((long)&start.field_2 + 8));
        NumToString<unsigned_long>((string *)&it,sVar3);
        std::operator+(&local_ab8,&local_ad8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it);
        std::operator+(&local_a98,&local_ab8,")\n");
        std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_a98);
        std::__cxx11::string::~string((string *)&local_a98);
        std::__cxx11::string::~string((string *)&local_ab8);
        std::__cxx11::string::~string((string *)&it);
        std::__cxx11::string::~string((string *)&local_ad8);
        std::__cxx11::string::~string((string *)&local_af8);
      }
      break;
    case BASE_TYPE_STRUCT:
      NamespacedName_abi_cxx11_
                ((string *)local_510,this,&((field->value).type.struct_def)->super_Definition);
      if ((struct_def->fixed & 1U) == 0) {
        std::operator+(&local_630,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                       ,"() -> ");
        std::operator+(&local_610,&local_630,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_510);
        std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_610);
        std::__cxx11::string::~string((string *)&local_610);
        std::__cxx11::string::~string((string *)&local_630);
        bVar1 = FieldDef::IsRequired(field);
        if (!bVar1) {
          std::__cxx11::string::operator+=((string *)code_ptr,"?");
        }
        std::__cxx11::string::operator+=((string *)code_ptr,":\n        ");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6d0,"let o = flatbuffers.field_",&local_6d1);
        pcVar2 = "table";
        if ((((field->value).type.struct_def)->fixed & 1U) != 0) {
          pcVar2 = "struct";
        }
        std::operator+(&local_6b0,&local_6d0,pcVar2);
        std::operator+(&local_690,&local_6b0,"(buf_, pos_, ");
        std::operator+(&local_670,&local_690,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&def.field_2 + 8));
        std::operator+(&local_650,&local_670,")\n        return ");
        std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_650);
        std::__cxx11::string::~string((string *)&local_650);
        std::__cxx11::string::~string((string *)&local_670);
        std::__cxx11::string::~string((string *)&local_690);
        std::__cxx11::string::~string((string *)&local_6b0);
        std::__cxx11::string::~string((string *)&local_6d0);
        std::allocator<char>::~allocator(&local_6d1);
        bVar1 = FieldDef::IsRequired(field);
        if (bVar1) {
          std::operator+(&local_6f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_510," { buf_, assert o }\n");
          std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_6f8);
          std::__cxx11::string::~string((string *)&local_6f8);
        }
        else {
          std::operator+(&local_738,"if o: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_510);
          std::operator+(&local_718,&local_738," { buf_, o } else: nil\n");
          std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_718);
          std::__cxx11::string::~string((string *)&local_718);
          std::__cxx11::string::~string((string *)&local_738);
        }
      }
      else {
        std::operator+(&local_570,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                       ,"() -> ");
        std::operator+(&local_550,&local_570,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_510);
        std::operator+(&local_530,&local_550,":\n        ");
        std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_530);
        std::__cxx11::string::~string((string *)&local_530);
        std::__cxx11::string::~string((string *)&local_550);
        std::__cxx11::string::~string((string *)&local_570);
        std::operator+(&local_5f0,"return ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_510);
        std::operator+(&local_5d0,&local_5f0,"{ buf_, pos_ + ");
        std::operator+(&local_5b0,&local_5d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&def.field_2 + 8));
        std::operator+(&local_590,&local_5b0," }\n");
        std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_590);
        std::__cxx11::string::~string((string *)&local_590);
        std::__cxx11::string::~string((string *)&local_5b0);
        std::__cxx11::string::~string((string *)&local_5d0);
        std::__cxx11::string::~string((string *)&local_5f0);
      }
      name.field_2._12_4_ = 2;
      std::__cxx11::string::~string((string *)local_510);
      break;
    case BASE_TYPE_UNION:
      pvVar4 = EnumDef::Vals((field->value).type.enum_def);
      local_b20._M_current =
           (EnumVal **)
           std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                     (pvVar4);
      while( true ) {
        pvVar4 = EnumDef::Vals((field->value).type.enum_def);
        ev = (EnumVal *)
             std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                       (pvVar4);
        bVar1 = __gnu_cxx::operator!=
                          (&local_b20,
                           (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                            *)&ev);
        if (!bVar1) break;
        ppEVar5 = __gnu_cxx::
                  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                  ::operator*(&local_b20);
        local_b30 = *ppEVar5;
        bVar1 = EnumVal::IsNonZero(local_b30);
        if (bVar1) {
          std::operator+(&local_c10,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_70,"_as_");
          std::operator+(&local_bf0,&local_c10,&local_b30->name);
          std::operator+(&local_bd0,&local_bf0,"():\n        return ");
          NamespacedName_abi_cxx11_
                    (&local_c30,this,&((local_b30->union_type).struct_def)->super_Definition);
          std::operator+(&local_bb0,&local_bd0,&local_c30);
          std::operator+(&local_b90,&local_bb0," { buf_, flatbuffers.field_table(buf_, pos_, ");
          std::operator+(&local_b70,&local_b90,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&def.field_2 + 8));
          std::operator+(&local_b50,&local_b70,") }\n");
          std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_b50);
          std::__cxx11::string::~string((string *)&local_b50);
          std::__cxx11::string::~string((string *)&local_b70);
          std::__cxx11::string::~string((string *)&local_b90);
          std::__cxx11::string::~string((string *)&local_bb0);
          std::__cxx11::string::~string((string *)&local_c30);
          std::__cxx11::string::~string((string *)&local_bd0);
          std::__cxx11::string::~string((string *)&local_bf0);
          std::__cxx11::string::~string((string *)&local_c10);
        }
        __gnu_cxx::
        __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
        ::operator++(&local_b20);
      }
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_lobster.cpp"
                    ,0xd0,
                    "void flatbuffers::lobster::LobsterGenerator::GenStructAccessor(const StructDef &, const FieldDef &, std::string *)"
                   );
    }
    bVar1 = IsVector(&(field->value).type);
    if (bVar1) {
      std::operator+(&local_c90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     "_length() -> int:\n        return flatbuffers.field_vector_len(buf_, pos_, ");
      std::operator+(&local_c70,&local_c90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&def.field_2 + 8));
      std::operator+(&local_c50,&local_c70,")\n");
      std::__cxx11::string::operator+=((string *)code_ptr,(string *)&local_c50);
      std::__cxx11::string::~string((string *)&local_c50);
      std::__cxx11::string::~string((string *)&local_c70);
      std::__cxx11::string::~string((string *)&local_c90);
    }
    name.field_2._12_4_ = 0;
  }
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(def.field_2._M_local_buf + 8));
  return;
}

Assistant:

void GenStructAccessor(const StructDef &struct_def, const FieldDef &field,
                         std::string *code_ptr) {
    GenComment(field.doc_comment, code_ptr, nullptr, "    ");
    std::string &code = *code_ptr;
    auto offsets = NumToString(field.value.offset);
    auto def = "    def " + NormalizedName(field);
    if (IsScalar(field.value.type.base_type)) {
      std::string acc;
      if (struct_def.fixed) {
        acc = "buf_.read_" + GenTypeName(field.value.type) + "_le(pos_ + " +
              offsets + ")";

      } else {
        auto defval = field.IsOptional()
                          ? (IsFloat(field.value.type.base_type) ? "0.0" : "0")
                          : field.value.constant;
        acc = "flatbuffers.field_" + GenTypeName(field.value.type) +
              "(buf_, pos_, " + offsets + ", " + defval + ")";
        if (IsBool(field.value.type.base_type)) acc = "bool(" + acc + ")";
      }
      if (field.value.type.enum_def)
        acc = NormalizedName(*field.value.type.enum_def) + "(" + acc + ")";
      if (field.IsOptional()) {
        acc += ", flatbuffers.field_present(buf_, pos_, " + offsets + ")";
        code += def + "() -> " + LobsterType(field.value.type) +
                ", bool:\n        return " + acc + "\n";
      } else {
        code += def + "() -> " + LobsterType(field.value.type) +
                ":\n        return " + acc + "\n";
      }
      return;
    }
    switch (field.value.type.base_type) {
      case BASE_TYPE_STRUCT: {
        auto name = NamespacedName(*field.value.type.struct_def);
        if (struct_def.fixed) {
          code += def + "() -> " + name + ":\n        ";
          code += "return " + name + "{ buf_, pos_ + " + offsets + " }\n";
        } else {
          code += def + "() -> " + name;
          if (!field.IsRequired()) code += "?";
          code += ":\n        ";
          code += std::string("let o = flatbuffers.field_") +
                  (field.value.type.struct_def->fixed ? "struct" : "table") +
                  "(buf_, pos_, " + offsets + ")\n        return ";
          if (field.IsRequired()) {
            code += name + " { buf_, assert o }\n";
          } else {
            code += "if o: " + name + " { buf_, o } else: nil\n";
          }
        }
        break;
      }
      case BASE_TYPE_STRING:
        code += def +
                "() -> string:\n        return "
                "flatbuffers.field_string(buf_, pos_, " +
                offsets + ")\n";
        break;
      case BASE_TYPE_VECTOR: {
        auto vectortype = field.value.type.VectorType();
        if (vectortype.base_type == BASE_TYPE_STRUCT) {
          auto start = "flatbuffers.field_vector(buf_, pos_, " + offsets +
                       ") + i * " + NumToString(InlineSize(vectortype));
          if (!(vectortype.struct_def->fixed)) {
            start = "flatbuffers.indirect(buf_, " + start + ")";
          }
          code += def + "(i:int) -> " +
                  NamespacedName(*field.value.type.struct_def) +
                  ":\n        return ";
          code += NamespacedName(*field.value.type.struct_def) + " { buf_, " +
                  start + " }\n";
        } else {
          if (IsString(vectortype)) {
            code += def + "(i:int) -> string:\n        return ";
            code += "flatbuffers.string";
          } else {
            code += def + "(i:int) -> " + LobsterType(vectortype) +
                    ":\n        return ";
            code += "read_" + GenTypeName(vectortype) + "_le";
          }
          code += "(buf_, buf_.flatbuffers.field_vector(pos_, " + offsets +
                  ") + i * " + NumToString(InlineSize(vectortype)) + ")\n";
        }
        break;
      }
      case BASE_TYPE_UNION: {
        for (auto it = field.value.type.enum_def->Vals().begin();
             it != field.value.type.enum_def->Vals().end(); ++it) {
          auto &ev = **it;
          if (ev.IsNonZero()) {
            code += def + "_as_" + ev.name + "():\n        return " +
                    NamespacedName(*ev.union_type.struct_def) +
                    " { buf_, flatbuffers.field_table(buf_, pos_, " + offsets +
                    ") }\n";
          }
        }
        break;
      }
      default: FLATBUFFERS_ASSERT(0);
    }
    if (IsVector(field.value.type)) {
      code += def +
              "_length() -> int:\n        return "
              "flatbuffers.field_vector_len(buf_, pos_, " +
              offsets + ")\n";
    }
  }